

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O0

void adios2::OpenSimpleResponseHandler
               (CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  long lVar1;
  undefined4 *in_RDX;
  undefined8 in_RDI;
  void *obj;
  OpenSimpleResponseMsg open_response_msg;
  
  lVar1 = CMCondition_get_client_data(in_RDI,*in_RDX);
  *(undefined8 *)(lVar1 + 0x98) = *(undefined8 *)(in_RDX + 2);
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)(in_RDX + 4);
  CMCondition_signal(in_RDI,*in_RDX);
  return;
}

Assistant:

void OpenSimpleResponseHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                               attr_list attrs)
{
    EVPathRemoteCommon::OpenSimpleResponseMsg open_response_msg =
        static_cast<EVPathRemoteCommon::OpenSimpleResponseMsg>(vevent);

    void *obj = CMCondition_get_client_data(cm, open_response_msg->OpenResponseCondition);
    static_cast<EVPathRemote *>(obj)->m_ID = open_response_msg->FileHandle;
    static_cast<EVPathRemote *>(obj)->m_Size = open_response_msg->FileSize;
    CMCondition_signal(cm, open_response_msg->OpenResponseCondition);
    return;
}